

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.h
# Opt level: O2

string * booster::locale::conv::from_utf<wchar_t>
                   (string *__return_storage_ptr__,wchar_t *begin,wchar_t *end,locale *loc,
                   method_type how)

{
  info *piVar1;
  string asStack_48 [32];
  
  piVar1 = std::use_facet<booster::locale::info>(loc);
  (**(code **)(*(long *)piVar1 + 0x10))(asStack_48,piVar1,3);
  booster::locale::conv::from_utf<wchar_t>
            ((wchar_t *)__return_storage_ptr__,begin,(string *)end,(method_type)asStack_48);
  std::__cxx11::string::~string(asStack_48);
  return __return_storage_ptr__;
}

Assistant:

std::string from_utf(CharType const *begin,CharType const *end,std::locale const &loc,method_type how=default_method)
            {
                return from_utf(begin,end,std::use_facet<info>(loc).encoding(),how);
            }